

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVF.cpp
# Opt level: O0

void __thiscall MT32Emu::TVF::reset(TVF *this,PartialParam *newPartialParam,uint basePitch)

{
  uint key_00;
  uint uVar1;
  int iVar2;
  Poly *pPVar3;
  Tables *pTVar4;
  Synth *pSVar5;
  int local_40;
  int newIncrement;
  int envTimeSetting;
  int newTarget;
  int newLevelMult;
  Tables *tables;
  uint velocity;
  uint key;
  uint basePitch_local;
  PartialParam *newPartialParam_local;
  TVF *this_local;
  
  this->partialParam = newPartialParam;
  pPVar3 = Partial::getPoly(this->partial);
  key_00 = Poly::getKey(pPVar3);
  pPVar3 = Partial::getPoly(this->partial);
  uVar1 = Poly::getVelocity(pPVar3);
  pTVar4 = Tables::getInstance();
  pSVar5 = Partial::getSynth(this->partial);
  iVar2 = calcBaseCutoff(newPartialParam,basePitch,key_00,
                         (*(ushort *)pSVar5->controlROMFeatures >> 6 & 1) != 0);
  this->baseCutoff = (Bit8u)iVar2;
  envTimeSetting =
       ((int)(key_00 - 0x3c) >> (4 - (newPartialParam->tvf).envDepthKeyfollow & 0x1f)) +
       (0x6d - (uint)(newPartialParam->tvf).envVeloSensitivity) +
       ((int)(uVar1 * (newPartialParam->tvf).envVeloSensitivity) >> 6);
  if (envTimeSetting < 0) {
    envTimeSetting = 0;
  }
  envTimeSetting = (int)((uint)(newPartialParam->tvf).envDepth * envTimeSetting) >> 6;
  if (0xff < envTimeSetting) {
    envTimeSetting = 0xff;
  }
  this->levelMult = envTimeSetting;
  if ((newPartialParam->tvf).envTimeKeyfollow == '\0') {
    this->keyTimeSubtraction = 0;
  }
  else {
    this->keyTimeSubtraction =
         (int)(key_00 - 0x3c) >> (5 - (newPartialParam->tvf).envTimeKeyfollow & 0x1f);
  }
  iVar2 = envTimeSetting * (uint)(newPartialParam->tvf).envLevel[0];
  local_40 = (uint)(newPartialParam->tvf).envTime[0] - this->keyTimeSubtraction;
  if (local_40 < 1) {
    local_40._0_1_ = 0xff;
  }
  else {
    local_40 = (uint)pTVar4->envLogarithmicTime[iVar2 >> 8] - local_40;
    if (local_40 < 1) {
      local_40 = 1;
    }
  }
  LA32Ramp::reset(this->cutoffModifierRamp);
  startRamp(this,(Bit8u)((uint)iVar2 >> 8),(Bit8u)local_40,1);
  return;
}

Assistant:

void TVF::reset(const TimbreParam::PartialParam *newPartialParam, unsigned int basePitch) {
	partialParam = newPartialParam;

	unsigned int key = partial->getPoly()->getKey();
	unsigned int velocity = partial->getPoly()->getVelocity();

	const Tables *tables = &Tables::getInstance();

	baseCutoff = calcBaseCutoff(newPartialParam, basePitch, key, partial->getSynth()->controlROMFeatures->quirkTVFBaseCutoffLimit);
#if MT32EMU_MONITOR_TVF >= 1
	partial->getSynth()->printDebug("[+%lu] [Partial %d] TVF,base,%d", partial->debugGetSampleNum(), partial->debugGetPartialNum(), baseCutoff);
#endif

	int newLevelMult = velocity * newPartialParam->tvf.envVeloSensitivity;
	newLevelMult >>= 6;
	newLevelMult += 109 - newPartialParam->tvf.envVeloSensitivity;
	newLevelMult += (signed(key) - 60) >> (4 - newPartialParam->tvf.envDepthKeyfollow);
	if (newLevelMult < 0) {
		newLevelMult = 0;
	}
	newLevelMult *= newPartialParam->tvf.envDepth;
	newLevelMult >>= 6;
	if (newLevelMult > 255) {
		newLevelMult = 255;
	}
	levelMult = newLevelMult;

	if (newPartialParam->tvf.envTimeKeyfollow != 0) {
		keyTimeSubtraction = (signed(key) - 60) >> (5 - newPartialParam->tvf.envTimeKeyfollow);
	} else {
		keyTimeSubtraction = 0;
	}

	int newTarget = (newLevelMult * newPartialParam->tvf.envLevel[0]) >> 8;
	int envTimeSetting = newPartialParam->tvf.envTime[0] - keyTimeSubtraction;
	int newIncrement;
	if (envTimeSetting <= 0) {
		newIncrement = (0x80 | 127);
	} else {
		newIncrement = tables->envLogarithmicTime[newTarget] - envTimeSetting;
		if (newIncrement <= 0) {
			newIncrement = 1;
		}
	}
	cutoffModifierRamp->reset();
	startRamp(newTarget, newIncrement, PHASE_2 - 1);
}